

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

ostream * amrex::operator<<(ostream *os,FabOnDisk *fod)

{
  ostream *poVar1;
  char local_1a [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"FabOnDisk:",10);
  local_1a[0] = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,local_1a,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(fod->m_name)._M_dataplus._M_p,(fod->m_name)._M_string_length);
  local_1a[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a + 1,1);
  std::ostream::_M_insert<long>((long)poVar1);
  if (*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0) {
    Error_host("Write of VisMF::FabOnDisk failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const VisMF::FabOnDisk& fod)
{
    os << TheFabOnDiskPrefix << ' ' << fod.m_name << ' ' << fod.m_head;

    if( ! os.good()) {
        amrex::Error("Write of VisMF::FabOnDisk failed");
    }

    return os;
}